

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrecursive_inotify_poller.cc
# Opt level: O0

void __thiscall
NonrecursiveInotifyPoller::NonrecursiveInotifyPoller(NonrecursiveInotifyPoller *this)

{
  int iVar1;
  NonrecursiveInotifyPoller *this_local;
  
  InotifyPoller::InotifyPoller(&this->super_InotifyPoller);
  (this->super_InotifyPoller)._vptr_InotifyPoller =
       (_func_int **)&PTR__NonrecursiveInotifyPoller_001aac90;
  iVar1 = inotify_init1(0x80800);
  this->fd_ = iVar1;
  std::
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->directories_);
  this->events_dropped_ = false;
  this->read_buffer_length_ = 0;
  this->read_buffer_offset_ = 0;
  if (this->fd_ < 0) {
    __assert_fail("fd_ >= 0 && \"Failed to create inotify descriptor\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/src/nonrecursive_inotify_poller.cc"
                  ,0x16,"NonrecursiveInotifyPoller::NonrecursiveInotifyPoller()");
  }
  return;
}

Assistant:

NonrecursiveInotifyPoller::NonrecursiveInotifyPoller()
    : fd_(inotify_init1(IN_NONBLOCK | IN_CLOEXEC)),
      events_dropped_(false),
      read_buffer_length_(0),
      read_buffer_offset_(0) {
  assert(fd_ >= 0 && "Failed to create inotify descriptor");
}